

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArrayTest.cpp
# Opt level: O3

void __thiscall
compressed_array_check_random_access_check_Test::TestBody
          (compressed_array_check_random_access_check_Test *this)

{
  pointer pRVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  _Bit_type *p_Var5;
  char *in_R9;
  vector<Record,_std::allocator<Record>_> local_378;
  AssertHelper local_358;
  undefined8 *local_350;
  AssertHelper local_348;
  undefined1 local_340 [8];
  _Bit_type *local_338;
  undefined1 local_330 [32];
  undefined1 local_310 [8];
  _Bit_type *local_308;
  vector<Record,_std::allocator<Record>_> local_2e0;
  vector<Record,_std::allocator<Record>_> local_2c8;
  vector<Record,_std::allocator<Record>_> local_2b0;
  undefined1 local_298 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Bit_type *local_278;
  pointer local_250;
  undefined **local_238;
  pointer local_230;
  undefined **local_218;
  pointer local_210;
  undefined **local_1f8;
  pointer local_1f0;
  undefined1 local_1c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Bit_type *local_1a8;
  pointer local_180;
  undefined **local_168;
  pointer local_160;
  undefined **local_148;
  pointer local_140;
  undefined **local_128;
  pointer local_120;
  undefined1 local_f8 [16];
  pointer local_e8;
  _Bit_type *local_d8;
  pointer local_b0;
  undefined **local_98;
  pointer local_90;
  undefined **local_78;
  pointer local_70;
  undefined **local_58;
  pointer local_50;
  
  create_records_1();
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_f8._0_8_;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_f8._8_8_;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_e8;
  std::vector<Record,_std::allocator<Record>_>::vector(&local_2b0,&local_378);
  CompressedArray::CompressedArray((CompressedArray *)local_f8,&local_2b0);
  if (local_2b0.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      pRVar1 = local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
               super__Vector_impl_data._M_start;
      CompressedArray::begin((const_iterator *)local_298,(CompressedArray *)local_f8);
      CompressedArray::const_iterator::operator+
                ((const_iterator *)local_1c8,(const_iterator *)local_298,(uint32_t)uVar4);
      local_340[0] = (internal)
                     check_same((Record *)((long)pRVar1 + uVar4 * 0x14),(const_iterator *)local_1c8)
      ;
      local_338 = (_Bit_type *)0x0;
      if (!(bool)local_340[0]) {
        testing::Message::Message((Message *)local_298);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c8,(internal *)local_340,
                   (AssertionResult *)"check_same(records[i], array1.begin() + i)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_310,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/test/basic_tests/CompressedArrayTest.cpp"
                   ,0x98,(char *)local_1c8);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_310,(Message *)local_298);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_310);
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8);
        }
        if (local_298 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_298 + 8))();
        }
        p_Var5 = local_338;
        if (local_338 == (_Bit_type *)0x0) goto LAB_0010d71c;
        if ((_Bit_type *)*local_338 != local_338 + 2) {
          operator_delete((_Bit_type *)*local_338);
        }
        goto LAB_0010d717;
      }
      uVar4 = (ulong)((uint32_t)uVar4 + 1);
      uVar3 = ((long)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  create_records_2();
  pRVar1 = local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1c8;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)paStack_1c0;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_1b8._M_allocated_capacity;
  local_1c8 = (undefined1  [8])0x0;
  paStack_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_1b8._M_allocated_capacity = 0;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pRVar1 !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0) && (operator_delete(pRVar1), local_1c8 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_1c8);
  }
  std::vector<Record,_std::allocator<Record>_>::vector(&local_2c8,&local_378);
  CompressedArray::CompressedArray((CompressedArray *)local_1c8,&local_2c8);
  if (local_2c8.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      pRVar1 = local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
               super__Vector_impl_data._M_start;
      CompressedArray::begin((const_iterator *)local_340,(CompressedArray *)local_1c8);
      CompressedArray::const_iterator::operator+
                ((const_iterator *)local_298,(const_iterator *)local_340,(uint32_t)uVar4);
      local_310[0] = (internal)
                     check_same((Record *)((long)pRVar1 + uVar4 * 0x14),(const_iterator *)local_298)
      ;
      local_308 = (_Bit_type *)0x0;
      if (!(bool)local_310[0]) {
        testing::Message::Message((Message *)local_340);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_298,(internal *)local_310,
                   (AssertionResult *)"check_same(records[i], array2.begin() + i)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_358,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/test/basic_tests/CompressedArrayTest.cpp"
                   ,0x9d,(char *)local_298);
        testing::internal::AssertHelper::operator=(&local_358,(Message *)local_340);
        testing::internal::AssertHelper::~AssertHelper(&local_358);
        if (local_298 != (undefined1  [8])&local_288) {
          operator_delete((void *)local_298);
        }
        if ((long *)CONCAT71(local_340._1_7_,local_340[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_340._1_7_,local_340[0]) + 8))();
        }
        p_Var5 = local_308;
        if (local_308 == (_Bit_type *)0x0) goto LAB_0010d690;
        if ((_Bit_type *)*local_308 != local_308 + 2) {
          operator_delete((_Bit_type *)*local_308);
        }
        goto LAB_0010d68b;
      }
      uVar4 = (ulong)((uint32_t)uVar4 + 1);
      uVar3 = ((long)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  create_records_3();
  pRVar1 = local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_298;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)paStack_290;
  local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_288._M_allocated_capacity;
  local_298 = (undefined1  [8])0x0;
  paStack_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_288._M_allocated_capacity = 0;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pRVar1 !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0) && (operator_delete(pRVar1), local_298 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_298);
  }
  std::vector<Record,_std::allocator<Record>_>::vector(&local_2e0,&local_378);
  CompressedArray::CompressedArray((CompressedArray *)local_298,&local_2e0);
  if (local_2e0.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e0.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      pRVar1 = local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
               super__Vector_impl_data._M_start;
      CompressedArray::begin((const_iterator *)local_310,(CompressedArray *)local_298);
      CompressedArray::const_iterator::operator+
                ((const_iterator *)local_340,(const_iterator *)local_310,(uint32_t)uVar4);
      local_358.data_._0_1_ =
           (internal)check_same((Record *)((long)pRVar1 + uVar4 * 0x14),(const_iterator *)local_340)
      ;
      local_350 = (undefined8 *)0x0;
      if (!(bool)local_358.data_._0_1_) {
        testing::Message::Message((Message *)local_310);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_340,(internal *)&local_358,
                   (AssertionResult *)"check_same(records[i], array3.begin() + i)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_348,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/test/basic_tests/CompressedArrayTest.cpp"
                   ,0xa2,(char *)CONCAT71(local_340._1_7_,local_340[0]));
        testing::internal::AssertHelper::operator=(&local_348,(Message *)local_310);
        testing::internal::AssertHelper::~AssertHelper(&local_348);
        if ((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]) != local_330) {
          operator_delete((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]));
        }
        if ((long *)CONCAT71(local_310._1_7_,local_310[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_310._1_7_,local_310[0]) + 8))();
        }
        puVar2 = local_350;
        if (local_350 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_350 != local_350 + 2) {
            operator_delete((undefined8 *)*local_350);
          }
          operator_delete(puVar2);
        }
        break;
      }
      uVar4 = (ulong)((uint32_t)uVar4 + 1);
      uVar3 = ((long)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  local_298 = (undefined1  [8])&PTR_dump_0014ecf8;
  local_1f8 = &PTR_dump_0014dde8;
  if (local_1f0 != (pointer)0x0) {
    operator_delete(local_1f0);
  }
  local_218 = &PTR_dump_0014dde8;
  if (local_210 != (pointer)0x0) {
    operator_delete(local_210);
  }
  local_238 = &PTR_dump_0014dde8;
  if (local_230 != (pointer)0x0) {
    operator_delete(local_230);
  }
  if (local_250 != (pointer)0x0) {
    operator_delete(local_250);
  }
  p_Var5 = local_278;
  if (local_278 != (_Bit_type *)0x0) {
LAB_0010d68b:
    operator_delete(p_Var5);
  }
LAB_0010d690:
  local_1c8 = (undefined1  [8])&PTR_dump_0014ecf8;
  local_128 = &PTR_dump_0014dde8;
  if (local_120 != (pointer)0x0) {
    operator_delete(local_120);
  }
  local_148 = &PTR_dump_0014dde8;
  if (local_140 != (pointer)0x0) {
    operator_delete(local_140);
  }
  local_168 = &PTR_dump_0014dde8;
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160);
  }
  if (local_180 != (pointer)0x0) {
    operator_delete(local_180);
  }
  p_Var5 = local_1a8;
  if (local_1a8 != (_Bit_type *)0x0) {
LAB_0010d717:
    operator_delete(p_Var5);
  }
LAB_0010d71c:
  local_f8._0_8_ = &PTR_dump_0014ecf8;
  local_58 = &PTR_dump_0014dde8;
  if (local_50 != (pointer)0x0) {
    operator_delete(local_50);
  }
  local_78 = &PTR_dump_0014dde8;
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70);
  }
  local_98 = &PTR_dump_0014dde8;
  if (local_90 != (pointer)0x0) {
    operator_delete(local_90);
  }
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0);
  }
  if (local_d8 != (_Bit_type *)0x0) {
    operator_delete(local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_378.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(compressed_array_check, random_access_check) {
    vector<Record> records;

    records = create_records_1();
    CompressedArray array1(records);
    for (uint32_t i = 0; i < records.size(); i++)
        ASSERT_TRUE(check_same(records[i], array1.begin() + i));

    records = create_records_2();
    CompressedArray array2(records);
    for (uint32_t i = 0; i < records.size(); i++)
        ASSERT_TRUE(check_same(records[i], array2.begin() + i));

    records = create_records_3();
    CompressedArray array3(records);
    for (uint32_t i = 0; i < records.size(); i++)
        ASSERT_TRUE(check_same(records[i], array3.begin() + i));
}